

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

uint32_t mp_decode_map(char **data)

{
  byte bVar1;
  uint16_t uVar2;
  uint8_t c;
  char **data_local;
  
  bVar1 = mp_load_u8(data);
  if (bVar1 == 0xde) {
    uVar2 = mp_load_u16(data);
    data_local._4_4_ = (uint)uVar2;
  }
  else if (bVar1 == 0xdf) {
    data_local._4_4_ = mp_load_u32(data);
  }
  else {
    if (-0x71 < (char)bVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                    ,0x64a,"uint32_t mp_decode_map(const char **)");
    }
    data_local._4_4_ = bVar1 & 0xf;
  }
  return data_local._4_4_;
}

Assistant:

MP_IMPL uint32_t
mp_decode_map(const char **data)
{
	uint8_t c = mp_load_u8(data);
	switch (c) {
	case 0xde:
		return mp_load_u16(data);
	case 0xdf:
		return mp_load_u32(data);
	default:
		if (mp_unlikely(c < 0x80 || c > 0x8f))
			mp_unreachable();
		return c & 0xf;
	}
}